

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_rect nk_layout_space_rect_to_screen(nk_context *ctx,nk_rect ret)

{
  undefined4 uVar1;
  undefined4 uVar2;
  nk_panel *pnVar3;
  undefined1 auVar4 [16];
  nk_rect nVar5;
  
  nVar5._8_8_ = ret._8_8_;
  pnVar3 = ctx->current->layout;
  uVar1 = pnVar3->at_x;
  uVar2 = pnVar3->at_y;
  auVar4._4_4_ = 0;
  auVar4._0_4_ = *pnVar3->offset_x;
  auVar4._8_4_ = *pnVar3->offset_y;
  auVar4._12_4_ = 0;
  nVar5.x = ret.x + ((float)uVar1 - (float)(SUB168(auVar4 | _DAT_0015c4c0,0) - (double)DAT_0015c4c0)
                    );
  nVar5.y = ret.y + ((float)uVar2 - (float)(SUB168(auVar4 | _DAT_0015c4c0,8) - DAT_0015c4c0._8_8_));
  return nVar5;
}

Assistant:

NK_API struct nk_rect
nk_layout_space_rect_to_screen(struct nk_context *ctx, struct nk_rect ret)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
win = ctx->current;
layout = win->layout;

ret.x += layout->at_x - (float)*layout->offset_x;
ret.y += layout->at_y - (float)*layout->offset_y;
return ret;
}